

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool __thiscall duckdb_re2::RE2::PossibleMatchRange(RE2 *this,string *min,string *max,int maxlen)

{
  bool bVar1;
  ulong uVar2;
  int in_ECX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string dmax;
  string dmin;
  char *c;
  int i;
  int n;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Prog *in_stack_ffffffffffffff40;
  string local_b8 [32];
  string local_98 [32];
  char *local_78;
  int local_6c;
  string local_68 [32];
  string local_48 [32];
  int local_28;
  int local_24;
  string *local_20;
  string *local_18;
  byte local_1;
  
  if (in_RDI[3]._M_string_length == 0) {
    local_1 = 0;
    goto LAB_008095f5;
  }
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = std::__cxx11::string::size();
  if (local_24 < local_28) {
    local_28 = local_24;
  }
  std::__cxx11::string::substr((ulong)local_48,(ulong)&in_RDI[2]._M_string_length);
  std::__cxx11::string::operator=(local_18,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::substr((ulong)local_68,(ulong)&in_RDI[2]._M_string_length);
  std::__cxx11::string::operator=(local_20,local_68);
  std::__cxx11::string::~string(local_68);
  if (*(int *)&in_RDI[2].field_0x4 < 0) {
    for (local_6c = 0; local_6c < local_28; local_6c = local_6c + 1) {
      local_78 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      if (('`' < *local_78) && (*local_78 < '{')) {
        *local_78 = *local_78 + -0x20;
      }
    }
  }
  std::__cxx11::string::string(local_98);
  std::__cxx11::string::string(local_b8);
  local_24 = local_24 - local_28;
  if ((local_24 < 1) ||
     (bVar1 = Prog::PossibleMatchRange
                        (in_stack_ffffffffffffff40,
                         (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         in_RDI,in_stack_ffffffffffffff2c), !bVar1)) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      PrefixSuccessor(in_RDI);
      goto LAB_008095d1;
    }
    std::__cxx11::string::operator=(local_18,anon_var_dwarf_6601ab + 9);
    std::__cxx11::string::operator=(local_20,anon_var_dwarf_6601ab + 9);
    local_1 = 0;
  }
  else {
    std::__cxx11::string::append(local_18);
    std::__cxx11::string::append(local_20);
LAB_008095d1:
    local_1 = 1;
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
LAB_008095f5:
  return (bool)(local_1 & 1);
}

Assistant:

bool RE2::PossibleMatchRange(std::string* min, std::string* max,
                             int maxlen) const {
  if (prog_ == NULL)
    return false;

  int n = static_cast<int>(prefix_.size());
  if (n > maxlen)
    n = maxlen;

  // Determine initial min max from prefix_ literal.
  *min = prefix_.substr(0, n);
  *max = prefix_.substr(0, n);
  if (prefix_foldcase_) {
    // prefix is ASCII lowercase; change *min to uppercase.
    for (int i = 0; i < n; i++) {
      char& c = (*min)[i];
      if ('a' <= c && c <= 'z')
        c += 'A' - 'a';
    }
  }

  // Add to prefix min max using PossibleMatchRange on regexp.
  std::string dmin, dmax;
  maxlen -= n;
  if (maxlen > 0 && prog_->PossibleMatchRange(&dmin, &dmax, maxlen)) {
    min->append(dmin);
    max->append(dmax);
  } else if (!max->empty()) {
    // prog_->PossibleMatchRange has failed us,
    // but we still have useful information from prefix_.
    // Round up *max to allow any possible suffix.
    PrefixSuccessor(max);
  } else {
    // Nothing useful.
    *min = "";
    *max = "";
    return false;
  }

  return true;
}